

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# target.c
# Opt level: O2

_Bool target_accept(wchar_t y,wchar_t x)

{
  _Bool _Var1;
  loc grid;
  square *psVar2;
  monster *mon;
  object *obj;
  
  grid = (loc)loc(x,y);
  psVar2 = square(cave,grid);
  if (psVar2->mon < 0) {
    return true;
  }
  if (player->timed[6] == 0) {
    psVar2 = square(cave,grid);
    if (0 < psVar2->mon) {
      mon = square_monster(cave,grid);
      _Var1 = monster_is_obvious(mon);
      if (_Var1) {
        return true;
      }
    }
    _Var1 = square_isvisibletrap((chunk_conflict *)player->cave,grid);
    if (_Var1) {
      return true;
    }
    for (obj = square_object((chunk_conflict *)player->cave,grid); obj != (object *)0x0;
        obj = obj->next) {
      if (obj->kind == unknown_item_kind) {
        return true;
      }
      _Var1 = ignore_known_item_ok(player,obj);
      if (!_Var1) {
        return true;
      }
    }
    _Var1 = square_isknown(cave,grid);
    if ((_Var1) && (_Var1 = square_isinteresting((chunk_conflict *)player->cave,grid), _Var1)) {
      return true;
    }
  }
  return false;
}

Assistant:

bool target_accept(int y, int x)
{
	struct loc grid = loc(x, y);
	struct object *obj;

	/* Player grids are always interesting */
	if (square(cave, grid)->mon < 0) return true;

	/* Handle hallucination */
	if (player->timed[TMD_IMAGE]) return false;

	/* Obvious monsters */
	if (square(cave, grid)->mon > 0) {
		struct monster *mon = square_monster(cave, grid);
		if (monster_is_obvious(mon)) {
			return true;
		}
	}

	/* Traps */
	if (square_isvisibletrap(player->cave, grid)) return true;

	/* Scan all objects in the grid */
	for (obj = square_object(player->cave, grid); obj; obj = obj->next) {
		/* Memorized object */
		if (obj->kind == unknown_item_kind
				 || !ignore_known_item_ok(player, obj)) {
			return true;
		}
	}

	/* Interesting memorized features */
	if (square_isknown(cave, grid)
			&& square_isinteresting(player->cave, grid)) {
		return true;
	}

	/* Nope */
	return false;
}